

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

Image * Image_Function::ConvertTo8Bit
                  (Image *__return_storage_ptr__,Image16Bit *in,uint32_t startXIn,uint32_t startYIn,
                  uint32_t width,uint32_t height)

{
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_short>>
            (in,startXIn,startYIn,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0,0,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,&local_58,width,height,in->_colorCount,'\x01');
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  ConvertTo8Bit(in,startXIn,startYIn,__return_storage_ptr__,0,0,width,height);
  return __return_storage_ptr__;
}

Assistant:

Image ConvertTo8Bit( const Image16Bit & in, uint32_t startXIn, uint32_t startYIn, uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );

        Image out = Image().generate( width, height, in.colorCount() );
        ConvertTo8Bit( in, startXIn, startYIn, out, 0, 0, width, height );

        return out;
    }